

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imtui-demo.cpp
# Opt level: O0

void ShowExampleMenuFile(void)

{
  bool bVar1;
  ImDrawList *this;
  ImDrawList *pIVar2;
  float fVar3;
  ImVec2 p_min;
  char *unaff_retaddr;
  ImVec2 p;
  char *name;
  int i_1;
  float sz;
  int i;
  bool in_stack_0000007e;
  bool in_stack_0000007f;
  char *in_stack_00000080;
  char *in_stack_00000088;
  undefined7 in_stack_00000100;
  bool in_stack_00000107;
  char *in_stack_00000108;
  undefined8 in_stack_ffffffffffffffc0;
  ImGuiSliderFlags flags;
  float in_stack_ffffffffffffffc8;
  float in_stack_ffffffffffffffcc;
  float in_stack_ffffffffffffffd0;
  float in_stack_ffffffffffffffd4;
  float *in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  int idx;
  float in_stack_fffffffffffffff0;
  ImVec2 in_stack_fffffffffffffff8;
  
  ImGui::MenuItem(in_stack_00000088,in_stack_00000080,in_stack_0000007f,in_stack_0000007e);
  ImGui::MenuItem(in_stack_00000088,in_stack_00000080,in_stack_0000007f,in_stack_0000007e);
  ImGui::MenuItem(in_stack_00000088,in_stack_00000080,in_stack_0000007f,in_stack_0000007e);
  bVar1 = ImGui::BeginMenu(in_stack_00000108,in_stack_00000107);
  if (bVar1) {
    ImGui::MenuItem(in_stack_00000088,in_stack_00000080,in_stack_0000007f,in_stack_0000007e);
    ImGui::MenuItem(in_stack_00000088,in_stack_00000080,in_stack_0000007f,in_stack_0000007e);
    ImGui::MenuItem(in_stack_00000088,in_stack_00000080,in_stack_0000007f,in_stack_0000007e);
    bVar1 = ImGui::BeginMenu(in_stack_00000108,in_stack_00000107);
    if (bVar1) {
      ImGui::MenuItem(in_stack_00000088,in_stack_00000080,in_stack_0000007f,in_stack_0000007e);
      ImGui::MenuItem(in_stack_00000088,in_stack_00000080,in_stack_0000007f,in_stack_0000007e);
      bVar1 = ImGui::BeginMenu(in_stack_00000108,in_stack_00000107);
      if (bVar1) {
        ShowExampleMenuFile();
        ImGui::EndMenu();
      }
      ImGui::EndMenu();
    }
    ImGui::EndMenu();
  }
  ImGui::MenuItem(in_stack_00000088,in_stack_00000080,in_stack_0000007f,in_stack_0000007e);
  ImGui::MenuItem(in_stack_00000088,in_stack_00000080,in_stack_0000007f,in_stack_0000007e);
  ImGui::Separator();
  bVar1 = ImGui::BeginMenu(in_stack_00000108,in_stack_00000107);
  if (bVar1) {
    ImGui::MenuItem((char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                    in_stack_ffffffffffffffe0,(bool *)in_stack_ffffffffffffffd8,
                    SUB41((uint)in_stack_ffffffffffffffd4 >> 0x18,0));
    ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffff8,0.0,60.0);
    ImGui::BeginChild((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      (ImVec2 *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      SUB81((ulong)in_stack_ffffffffffffffc0 >> 0x38,0),
                      (ImGuiWindowFlags)in_stack_ffffffffffffffc0);
    for (fVar3 = 0.0; flags = (ImGuiSliderFlags)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
        (int)fVar3 < 10; fVar3 = (float)((int)fVar3 + 1)) {
      ImGui::Text("Scrolling Text %d",(ulong)(uint)fVar3);
    }
    ImGui::EndChild();
    ImGui::SliderFloat(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4
                       ,in_stack_ffffffffffffffd0,
                       (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),flags);
    ImGui::InputFloat(unaff_retaddr,(float *)in_stack_fffffffffffffff8,fVar3,
                      in_stack_fffffffffffffff0,
                      (char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      (ImGuiInputTextFlags)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
    ImGui::Combo(in_stack_ffffffffffffffe0,(int *)in_stack_ffffffffffffffd8,
                 (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 (int)in_stack_ffffffffffffffcc);
    ImGui::EndMenu();
  }
  bVar1 = ImGui::BeginMenu(in_stack_00000108,in_stack_00000107);
  if (bVar1) {
    fVar3 = ImGui::GetTextLineHeight();
    for (idx = 0; idx < 0x35; idx = idx + 1) {
      this = (ImDrawList *)ImGui::GetStyleColorName(idx);
      p_min = ImGui::GetCursorScreenPos();
      pIVar2 = ImGui::GetWindowDrawList();
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffd0,p_min.x + fVar3,p_min.y + fVar3);
      ImGui::GetColorU32((ImGuiCol)in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
      ImDrawList::AddRectFilled
                (this,(ImVec2 *)p_min,
                 (ImVec2 *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 (ImU32)in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                 (ImDrawCornerFlags)((ulong)pIVar2 >> 0x20));
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffc8,fVar3,fVar3);
      ImGui::Dummy((ImVec2 *)this);
      ImGui::SameLine((float)((ulong)pIVar2 >> 0x20),SUB84(pIVar2,0));
      ImGui::MenuItem(in_stack_00000088,in_stack_00000080,in_stack_0000007f,in_stack_0000007e);
    }
    ImGui::EndMenu();
  }
  bVar1 = ImGui::BeginMenu(in_stack_00000108,in_stack_00000107);
  if (bVar1) {
    ImGui::Checkbox(in_stack_00000108,(bool *)CONCAT17(in_stack_00000107,in_stack_00000100));
    ImGui::EndMenu();
  }
  ImGui::BeginMenu(in_stack_00000108,in_stack_00000107);
  ImGui::MenuItem(in_stack_00000088,in_stack_00000080,in_stack_0000007f,in_stack_0000007e);
  ImGui::MenuItem(in_stack_00000088,in_stack_00000080,in_stack_0000007f,in_stack_0000007e);
  return;
}

Assistant:

static void ShowExampleMenuFile()
{
    ImGui::MenuItem("(dummy menu)", NULL, false, false);
    if (ImGui::MenuItem("New")) {}
    if (ImGui::MenuItem("Open", "Ctrl+O")) {}
    if (ImGui::BeginMenu("Open Recent"))
    {
        ImGui::MenuItem("fish_hat.c");
        ImGui::MenuItem("fish_hat.inl");
        ImGui::MenuItem("fish_hat.h");
        if (ImGui::BeginMenu("More.."))
        {
            ImGui::MenuItem("Hello");
            ImGui::MenuItem("Sailor");
            if (ImGui::BeginMenu("Recurse.."))
            {
                ShowExampleMenuFile();
                ImGui::EndMenu();
            }
            ImGui::EndMenu();
        }
        ImGui::EndMenu();
    }
    if (ImGui::MenuItem("Save", "Ctrl+S")) {}
    if (ImGui::MenuItem("Save As..")) {}
    ImGui::Separator();
    if (ImGui::BeginMenu("Options"))
    {
        static bool enabled = true;
        ImGui::MenuItem("Enabled", "", &enabled);
        ImGui::BeginChild("child", ImVec2(0, 8), true);
        for (int i = 0; i < 10; i++)
            ImGui::Text("Scrolling Text %d", i);
        ImGui::EndChild();
        static float f = 0.5f;
        static int n = 0;
        static bool b = true;
        ImGui::SliderFloat("Value", &f, 0.0f, 1.0f);
        ImGui::InputFloat("Input", &f, 0.1f);
        ImGui::Combo("Combo", &n, "Yes\0No\0Maybe\0\0");
        ImGui::Checkbox("Check", &b);
        ImGui::EndMenu();
    }
    if (ImGui::BeginMenu("Colors"))
    {
        float sz = ImGui::GetTextLineHeight();
        for (int i = 0; i < ImGuiCol_COUNT; i++)
        {
            const char* name = ImGui::GetStyleColorName((ImGuiCol)i);
            ImVec2 p = ImGui::GetCursorScreenPos();
            ImGui::GetWindowDrawList()->AddRectFilled(p, ImVec2(p.x+sz, p.y+sz), ImGui::GetColorU32((ImGuiCol)i));
            ImGui::Dummy(ImVec2(sz, sz));
            ImGui::SameLine();
            ImGui::MenuItem(name);
        }
        ImGui::EndMenu();
    }
    if (ImGui::BeginMenu("Disabled", false)) // Disabled
    {
        IM_ASSERT(0);
    }
    if (ImGui::MenuItem("Checked", NULL, true)) {}
    if (ImGui::MenuItem("Quit", "Alt+F4")) {}
}